

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxmerge.cpp
# Opt level: O0

ogt_vox_scene * load_vox_scene(char *filename,uint32_t scene_read_flags)

{
  FILE *__stream;
  ulong uVar1;
  uint8_t *buffer_00;
  ogt_vox_scene *scene;
  uint8_t *buffer;
  uint32_t buffer_size;
  FILE *fp;
  uint32_t scene_read_flags_local;
  char *filename_local;
  
  __stream = (FILE *)open_file(filename,"rb");
  if (__stream == (FILE *)0x0) {
    filename_local = (char *)0x0;
  }
  else {
    fseek(__stream,0,2);
    uVar1 = ftell(__stream);
    fseek(__stream,0,0);
    buffer_00 = (uint8_t *)operator_new__(uVar1 & 0xffffffff);
    fread(buffer_00,uVar1 & 0xffffffff,1,__stream);
    fclose(__stream);
    filename_local =
         (char *)ogt_vox_read_scene_with_flags(buffer_00,(uint32_t)uVar1,scene_read_flags);
    if (buffer_00 != (uint8_t *)0x0) {
      operator_delete__(buffer_00);
    }
  }
  return (ogt_vox_scene *)filename_local;
}

Assistant:

const ogt_vox_scene* load_vox_scene(const char* filename, uint32_t scene_read_flags = 0)
{
    // open the file
    FILE * fp = open_file(filename, "rb");
    if (!fp)
        return NULL;

    // get the buffer size which matches the size of the file
    fseek(fp, 0, SEEK_END);
    uint32_t buffer_size = ftell(fp);
    fseek(fp, 0, SEEK_SET);

    // load the file into a memory buffer
    uint8_t * buffer = new uint8_t[buffer_size];
    fread(buffer, buffer_size, 1, fp);
    fclose(fp);

    // construct the scene from the buffer
    const ogt_vox_scene * scene = ogt_vox_read_scene_with_flags(buffer, buffer_size, scene_read_flags);

    // the buffer can be safely deleted once the scene is instantiated.
    delete[] buffer;

    return scene;
}